

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O1

void __thiscall Assimp::STEP::LazyObject::LazyInit(LazyObject *this)

{
  uint64_t *puVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  *this_00;
  const_iterator cVar2;
  Object *pOVar3;
  TypeError *this_01;
  code *pcVar4;
  shared_ptr<const_Assimp::STEP::EXPRESS::LIST> conv_args;
  char *acopy;
  key_type local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_28;
  
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
             *)this->db->schema;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,this->type,(allocator<char> *)&local_48);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
          ::find(this_00,&local_68);
  if ((_Rb_tree_header *)cVar2._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
    pcVar4 = (code *)0x0;
  }
  else {
    pcVar4 = *(code **)(cVar2._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (pcVar4 != (code *)0x0) {
    local_28 = this->args;
    EXPRESS::LIST::Parse
              ((char **)&local_48,(uint64_t)&local_28,(ConversionSchema *)0xffffffffffffffff);
    if (this->args != (char *)0x0) {
      operator_delete__(this->args);
    }
    this->args = (char *)0x0;
    pOVar3 = (Object *)(*pcVar4)(this->db,local_48._M_dataplus._M_p);
    this->obj = pOVar3;
    puVar1 = &this->db->evaluated_count;
    *puVar1 = *puVar1 + 1;
    if (this->obj != (Object *)0x0) {
      this->obj->id = this->id;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
      }
      return;
    }
    __assert_fail("obj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/STEPParser/STEPFileReader.cpp"
                  ,0x22b,"void Assimp::STEP::LazyObject::LazyInit() const");
  }
  this_01 = (TypeError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,this->type,(allocator<char> *)&local_28);
  std::operator+(&local_68,"unknown object type: ",&local_48);
  TypeError::TypeError(this_01,&local_68,this->id,0xffffffffffffffff);
  __cxa_throw(this_01,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void STEP::LazyObject::LazyInit() const {
    const EXPRESS::ConversionSchema& schema = db.GetSchema();
    STEP::ConvertObjectProc proc = schema.GetConverterProc(type);

    if (!proc) {
        throw STEP::TypeError("unknown object type: " + std::string(type),id);
    }

    const char* acopy = args;
    std::shared_ptr<const EXPRESS::LIST> conv_args = EXPRESS::LIST::Parse(acopy,STEP::SyntaxError::LINE_NOT_SPECIFIED,&db.GetSchema());
    delete[] args;
    args = NULL;

    // if the converter fails, it should throw an exception, but it should never return NULL
    try {
        obj = proc(db,*conv_args);
    }
    catch(const TypeError& t) {
        // augment line and entity information
        throw TypeError(t.what(),id);
    }
    ++db.evaluated_count;
    ai_assert(obj);

    // store the original id in the object instance
    obj->SetID(id);
}